

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_low_impl.h
# Opt level: O3

void secp256k1_scalar_set_b32(secp256k1_scalar *r,uchar *b32,int *overflow)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  
  *r = 0;
  lVar2 = 0;
  iVar1 = 0;
  uVar3 = 0;
  do {
    uVar3 = (uint)b32[lVar2] | uVar3 << 8;
    if (0xc < uVar3) {
      iVar1 = 1;
      uVar3 = uVar3 - (uVar3 / 0xd + (uVar3 / 0xd) * 0xc);
    }
    *r = uVar3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x20);
  if (overflow != (int *)0x0) {
    *overflow = iVar1;
    uVar3 = *r;
  }
  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar3);
  return;
}

Assistant:

static void secp256k1_scalar_set_b32(secp256k1_scalar *r, const unsigned char *b32, int *overflow) {
    int i;
    int over = 0;
    *r = 0;
    for (i = 0; i < 32; i++) {
        *r = (*r * 0x100) + b32[i];
        if (*r >= EXHAUSTIVE_TEST_ORDER) {
            over = 1;
            *r %= EXHAUSTIVE_TEST_ORDER;
        }
    }
    if (overflow) *overflow = over;

    SECP256K1_SCALAR_VERIFY(r);
}